

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_fill(Integer g_a,void *val)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  Integer I_elems;
  char err_string [256];
  long local_140;
  char *local_138 [33];
  
  iVar4 = _ga_sync_end;
  bVar9 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  iVar1 = GA[g_a + 1000].p_handle;
  if (bVar9) {
    pnga_pgroup_sync((long)iVar1);
  }
  if ((g_a < -1000) || ((long)_max_global_array <= g_a + 1000)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","ga_fill");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[g_a + 1000].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","ga_fill");
    pnga_error((char *)local_138,g_a);
  }
  iVar6 = (int)g_a + 1000;
  iVar2 = GA[iVar6].type;
  if ((0xff < iVar2 - 1000U) || (ga_types[iVar2 - 1000].active == 0)) {
    pnga_error("type not yet supported",(long)iVar2);
  }
  lVar5 = GA[iVar6].size / (long)GA[iVar6].elemsize;
  if (GA[iVar6].block_total < 0) {
    lVar8 = GAme;
    if (-1 < iVar1) {
      lVar8 = (long)PGRP_LIST[GA[iVar6].p_handle].map_proc_list[GAme];
    }
    local_138[0] = GA[iVar6].ptr[lVar8];
    switch(GA[iVar6].type) {
    case 0x3e9:
      if (0 < lVar5) {
        lVar8 = 0;
        do {
          *(undefined4 *)(local_138[0] + lVar8 * 4) = *val;
          lVar8 = lVar8 + 1;
        } while (lVar5 != lVar8);
      }
      break;
    case 0x3ea:
      if (0 < lVar5) {
        lVar8 = 0;
        do {
          *(undefined8 *)(local_138[0] + lVar8 * 8) = *val;
          lVar8 = lVar8 + 1;
        } while (lVar5 != lVar8);
      }
      break;
    case 0x3eb:
      if (0 < lVar5) {
        lVar8 = 0;
        do {
          *(undefined4 *)(local_138[0] + lVar8 * 4) = *val;
          lVar8 = lVar8 + 1;
        } while (lVar5 != lVar8);
      }
      break;
    case 0x3ec:
      if (0 < lVar5) {
        lVar8 = 0;
        do {
          *(undefined8 *)(local_138[0] + lVar8 * 8) = *val;
          lVar8 = lVar8 + 1;
        } while (lVar5 != lVar8);
      }
      break;
    default:
      pnga_error("type not supported",(long)GA[iVar6].type);
      break;
    case 0x3ee:
      if (0 < lVar5) {
        lVar8 = 0;
        do {
          *(undefined8 *)(local_138[0] + lVar8 * 8) = *val;
          lVar8 = lVar8 + 1;
        } while (lVar5 != lVar8);
      }
      break;
    case 0x3ef:
      pcVar7 = local_138[0];
      if (0 < lVar5) {
        do {
          uVar3 = *(undefined8 *)((long)val + 8);
          *(undefined8 *)pcVar7 = *val;
          *(undefined8 *)(pcVar7 + 8) = uVar3;
          pcVar7 = pcVar7 + 0x10;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      break;
    case 0x3f8:
      if (0 < lVar5) {
        lVar8 = 0;
        do {
          *(undefined8 *)(local_138[0] + lVar8 * 8) = *val;
          lVar8 = lVar8 + 1;
        } while (lVar5 != lVar8);
      }
    }
  }
  else {
    local_140 = lVar5;
    pnga_access_block_segment_ptr(g_a,GAme,local_138,&local_140);
    switch(GA[iVar6].type) {
    case 0x3e9:
      if (0 < local_140) {
        lVar5 = 0;
        do {
          *(undefined4 *)(local_138[0] + lVar5 * 4) = *val;
          lVar5 = lVar5 + 1;
        } while (local_140 != lVar5);
      }
      break;
    case 0x3ea:
      if (0 < local_140) {
        lVar5 = 0;
        do {
          *(undefined8 *)(local_138[0] + lVar5 * 8) = *val;
          lVar5 = lVar5 + 1;
        } while (local_140 != lVar5);
      }
      break;
    case 0x3eb:
      if (0 < local_140) {
        lVar5 = 0;
        do {
          *(undefined4 *)(local_138[0] + lVar5 * 4) = *val;
          lVar5 = lVar5 + 1;
        } while (local_140 != lVar5);
      }
      break;
    case 0x3ec:
      if (0 < local_140) {
        lVar5 = 0;
        do {
          *(undefined8 *)(local_138[0] + lVar5 * 8) = *val;
          lVar5 = lVar5 + 1;
        } while (local_140 != lVar5);
      }
      break;
    default:
      pnga_error("type not supported",(long)GA[iVar6].type);
      break;
    case 0x3ee:
      if (0 < local_140) {
        lVar5 = 0;
        do {
          *(undefined8 *)(local_138[0] + lVar5 * 8) = *val;
          lVar5 = lVar5 + 1;
        } while (local_140 != lVar5);
      }
      break;
    case 0x3ef:
      lVar5 = local_140;
      pcVar7 = local_138[0];
      if (0 < local_140) {
        do {
          uVar3 = *(undefined8 *)((long)val + 8);
          *(undefined8 *)pcVar7 = *val;
          *(undefined8 *)(pcVar7 + 8) = uVar3;
          lVar5 = lVar5 + -1;
          pcVar7 = pcVar7 + 0x10;
        } while (lVar5 != 0);
      }
      break;
    case 0x3f8:
      if (0 < local_140) {
        lVar5 = 0;
        do {
          *(undefined8 *)(local_138[0] + lVar5 * 8) = *val;
          lVar5 = lVar5 + 1;
        } while (local_140 != lVar5);
      }
    }
    pnga_release_block_segment(g_a,GAme);
  }
  if (iVar4 != 0) {
    pnga_pgroup_sync((long)iVar1);
  }
  return;
}

Assistant:

void pnga_fill(Integer g_a, void* val)
{
  int i,handle=GA_OFFSET + (int)g_a;
  char *ptr;
  int local_sync_begin,local_sync_end;
  C_Long elems;
  Integer grp_id;
  Integer num_blocks;


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  grp_id = pnga_get_pgroup(g_a);
  if(local_sync_begin)pnga_pgroup_sync(grp_id);


  ga_check_handleM(g_a, "ga_fill");
  gam_checktype(GA[handle].type);
  elems = GA[handle].size/((C_Long)GA[handle].elemsize);
  num_blocks = GA[handle].block_total;

  if (num_blocks < 0) {
    /* Bruce..Please CHECK if this is correct */
    if (grp_id >= 0){  
      Integer grp_me = PGRP_LIST[GA[handle].p_handle].map_proc_list[GAme];
      ptr = GA[handle].ptr[grp_me];
    }
    else  ptr = GA[handle].ptr[GAme];

    switch (GA[handle].type){
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*)val;
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*)val;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*)val;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*)val;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*)val;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*( long long*)val;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
  } else {
    Integer I_elems = (Integer)elems;
    pnga_access_block_segment_ptr(g_a,GAme,&ptr,&I_elems);
    elems = (C_Long)I_elems;
    switch (GA[handle].type){
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*)val;
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*)val;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*)val;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*)val;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*)val;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*(long long*)val;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
    pnga_release_block_segment(g_a,GAme);
  }

  if(local_sync_end)pnga_pgroup_sync(grp_id);

}